

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioReadBench.c
# Opt level: O2

void Io_ReadBenchInit(Abc_Ntk_t *pNtk,char *pFileName)

{
  char cVar1;
  Abc_Obj_t *pLatch;
  int i;
  FILE *__stream;
  char *pcVar2;
  long *plVar3;
  char *pcVar4;
  char pBuffer [1000];
  
  __stream = fopen(pFileName,"r");
  if (__stream == (FILE *)0x0) {
    printf("Io_ReadBenchInit(): Failed to open file \"%s\".\n",pFileName);
    return;
  }
  do {
    while( true ) {
      pcVar2 = fgets(pBuffer,999,__stream);
      if (pcVar2 == (char *)0x0) {
        fclose(__stream);
        return;
      }
      pcVar2 = strtok(pBuffer," \n\t\r");
      i = Nm_ManFindIdByName(pNtk->pManName,pcVar2,5);
      if (-1 < i) break;
      pcVar4 = "Io_ReadBenchInit(): Cannot find register with output %s.\n";
LAB_002d988d:
      printf(pcVar4,pcVar2);
    }
    plVar3 = (long *)Vec_PtrEntry(pNtk->vObjs,i);
    pLatch = *(Abc_Obj_t **)(*(long *)(*(long *)(*plVar3 + 0x20) + 8) + (long)*(int *)plVar3[4] * 8)
    ;
    if ((*(uint *)&pLatch->field_0x14 & 0xf) != 8) {
      pcVar4 = "Io_ReadBenchInit(): The signal is not a register output %s.\n";
      goto LAB_002d988d;
    }
    pcVar2 = strtok((char *)0x0," \n\t\r");
    cVar1 = *pcVar2;
    if (cVar1 == '2') {
      Abc_LatchSetInitDc(pLatch);
    }
    else if (cVar1 == '1') {
      Abc_LatchSetInit1(pLatch);
    }
    else if (cVar1 == '0') {
      Abc_LatchSetInit0(pLatch);
    }
    else {
      pcVar4 = Abc_ObjName((Abc_Obj_t *)pLatch->pNtk->vObjs->pArray[*(pLatch->vFanouts).pArray]);
      printf("Io_ReadBenchInit(): The signal %s has unknown initial value (%s).\n",pcVar4,pcVar2);
    }
  } while( true );
}

Assistant:

void Io_ReadBenchInit( Abc_Ntk_t * pNtk, char * pFileName )
{
    char pBuffer[1000];
    FILE * pFile;
    char * pToken;
    Abc_Obj_t * pObj;
    int Num;
    pFile = fopen( pFileName, "r" );
    if ( pFile == NULL )
    {
        printf( "Io_ReadBenchInit(): Failed to open file \"%s\".\n", pFileName );
        return;
    }
    while ( fgets( pBuffer, 999, pFile ) )
    {
        pToken = strtok( pBuffer, " \n\t\r" );
        // find the latch output
        Num = Nm_ManFindIdByName( pNtk->pManName, pToken, ABC_OBJ_BO );
        if ( Num < 0 )
        {
            printf( "Io_ReadBenchInit(): Cannot find register with output %s.\n", pToken );
            continue;
        }
        pObj = Abc_ObjFanin0( Abc_NtkObj( pNtk, Num ) );
        if ( !Abc_ObjIsLatch(pObj) )
        {
            printf( "Io_ReadBenchInit(): The signal is not a register output %s.\n", pToken );
            continue;
        }
        // assign the new init state
        pToken = strtok( NULL, " \n\t\r" );
        if ( pToken[0] == '0' )
            Abc_LatchSetInit0( pObj );
        else if ( pToken[0] == '1' )
            Abc_LatchSetInit1( pObj );
        else if ( pToken[0] == '2' )
            Abc_LatchSetInitDc( pObj );
        else
        {
            printf( "Io_ReadBenchInit(): The signal %s has unknown initial value (%s).\n", 
                Abc_ObjName(Abc_ObjFanout0(pObj)), pToken );
            continue;
        }
    }
    fclose( pFile );
}